

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::read(InMemoryFile *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  ulong __n;
  
  uVar2 = CONCAT44(in_register_00000034,__fd);
  kj::_::Mutex::lock(&(this->impl).mutex,1);
  uVar1 = (this->impl).value.size;
  __n = uVar1 - uVar2;
  if (uVar1 < uVar2 || __n == 0) {
    __n = 0;
  }
  else {
    if (__nbytes < __n) {
      __n = __nbytes;
    }
    memcpy(__buf,(this->impl).value.bytes.ptr + uVar2,__n);
  }
  kj::_::Mutex::unlock(&(this->impl).mutex,SHARED,(Waiter *)0x0);
  return __n;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    auto lock = impl.lockShared();
    if (offset >= lock->size) {
      // Entirely out-of-range.
      return 0;
    }

    size_t readSize = kj::min(buffer.size(), lock->size - offset);
    memcpy(buffer.begin(), lock->bytes.begin() + offset, readSize);
    return readSize;
  }